

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractnetworkcache.cpp
# Opt level: O1

void __thiscall QNetworkCacheMetaData::setSaveToDisk(QNetworkCacheMetaData *this,bool allow)

{
  QNetworkCacheMetaDataPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QNetworkCacheMetaDataPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QNetworkCacheMetaDataPrivate>::detach_helper(&this->d);
  }
  ((this->d).d.ptr)->saveToDisk = allow;
  return;
}

Assistant:

void QNetworkCacheMetaData::setSaveToDisk(bool allow)
{
    d->saveToDisk = allow;
}